

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::SequenceDeclarationSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,SequenceDeclarationSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  Token token_03;
  SyntaxNode *node;
  SyntaxNode *local_a0;
  SyntaxNode *local_90;
  size_t index_local;
  SequenceDeclarationSyntax *this_local;
  
  switch(index) {
  case 0:
    local_90 = (SyntaxNode *)0x0;
    if (this != (SequenceDeclarationSyntax *)0xfffffffffffffff0) {
      local_90 = &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode;
    }
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,local_90);
    break;
  case 1:
    token.kind = (this->keyword).kind;
    token._2_1_ = (this->keyword).field_0x2;
    token.numFlags.raw = (this->keyword).numFlags.raw;
    token.rawLen = (this->keyword).rawLen;
    token.info = (this->keyword).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 2:
    token_00.kind = (this->name).kind;
    token_00._2_1_ = (this->name).field_0x2;
    token_00.numFlags.raw = (this->name).numFlags.raw;
    token_00.rawLen = (this->name).rawLen;
    token_00.info = (this->name).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 3:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,&this->portList->super_SyntaxNode);
    break;
  case 4:
    token_01.kind = (this->semi).kind;
    token_01._2_1_ = (this->semi).field_0x2;
    token_01.numFlags.raw = (this->semi).numFlags.raw;
    token_01.rawLen = (this->semi).rawLen;
    token_01.info = (this->semi).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_01);
    break;
  case 5:
    local_a0 = (SyntaxNode *)0x0;
    if (this != (SequenceDeclarationSyntax *)0xffffffffffffff88) {
      local_a0 = &(this->variables).super_SyntaxListBase.super_SyntaxNode;
    }
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,local_a0);
    break;
  case 6:
    node = &not_null<slang::syntax::SequenceExprSyntax_*>::get(&this->seqExpr)->super_SyntaxNode;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,node);
    break;
  case 7:
    token_02.kind = (this->optionalSemi).kind;
    token_02._2_1_ = (this->optionalSemi).field_0x2;
    token_02.numFlags.raw = (this->optionalSemi).numFlags.raw;
    token_02.rawLen = (this->optionalSemi).rawLen;
    token_02.info = (this->optionalSemi).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_02);
    break;
  case 8:
    token_03.kind = (this->end).kind;
    token_03._2_1_ = (this->end).field_0x2;
    token_03.numFlags.raw = (this->end).numFlags.raw;
    token_03.rawLen = (this->end).rawLen;
    token_03.info = (this->end).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_03);
    break;
  case 9:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,&this->endBlockName->super_SyntaxNode);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax SequenceDeclarationSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return keyword;
        case 2: return name;
        case 3: return portList;
        case 4: return semi;
        case 5: return &variables;
        case 6: return seqExpr.get();
        case 7: return optionalSemi;
        case 8: return end;
        case 9: return endBlockName;
        default: return nullptr;
    }
}